

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

void * checkclib(lua_State *L,char *path)

{
  void *pvVar1;
  void *plib;
  char *path_local;
  lua_State *L_local;
  
  lua_getfield(L,-0xf4628,"_CLIBS");
  lua_getfield(L,-1,path);
  pvVar1 = lua_touserdata(L,-1);
  lua_settop(L,-3);
  return pvVar1;
}

Assistant:

static void *checkclib (lua_State *L, const char *path) {
  void *plib;
  lua_getfield(L, LUA_REGISTRYINDEX, CLIBS);
  lua_getfield(L, -1, path);
  plib = lua_touserdata(L, -1);  /* plib = CLIBS[path] */
  lua_pop(L, 2);  /* pop CLIBS table and 'plib' */
  return plib;
}